

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O2

bool bssl::anon_unknown_20::CheckResponderIDMatchesCertificate
               (ResponderID *id,ParsedCertificate *cert)

{
  Input b_rdn_sequence;
  Input a_rdn_sequence;
  Input value;
  bool bVar1;
  EVP_MD *type;
  Input *in_RCX;
  Input spki_tlv;
  Input cert_rdn;
  Input name_rdn;
  Input key;
  Input local_68;
  Input local_58;
  Parser local_48;
  Parser local_30;
  
  if (id->type == KEY_HASH) {
    local_48.cbs_.data = (uchar *)0x0;
    local_48.cbs_.len = 0;
    spki_tlv.data_.size_ = (size_t)&local_48;
    spki_tlv.data_.data_ = (uchar *)(cert->tbs_).spki_tlv.data_.size_;
    bVar1 = GetSubjectPublicKeyBytes
                      ((anon_unknown_20 *)(cert->tbs_).spki_tlv.data_.data_,spki_tlv,in_RCX);
    if (bVar1) {
      type = EVP_sha1();
      value.data_.size_ = local_48.cbs_.len;
      value.data_.data_ = local_48.cbs_.data;
      bVar1 = VerifyHash((EVP_MD *)type,(Input)(id->key_hash).data_,value);
      return bVar1;
    }
  }
  else if (id->type == NAME) {
    local_58.data_.data_ = (uchar *)0x0;
    local_58.data_.size_ = 0;
    local_68.data_.data_ = (uchar *)0x0;
    local_68.data_.size_ = 0;
    bssl::der::Parser::Parser(&local_48,(Input)(id->name).data_);
    bVar1 = bssl::der::Parser::ReadTag(&local_48,0x20000010,&local_58);
    if (bVar1) {
      bssl::der::Parser::Parser(&local_30,(Input)(cert->tbs_).subject_tlv.data_);
      bVar1 = bssl::der::Parser::ReadTag(&local_30,0x20000010,&local_68);
      if (bVar1) {
        a_rdn_sequence.data_.size_ = local_58.data_.size_;
        a_rdn_sequence.data_.data_ = local_58.data_.data_;
        b_rdn_sequence.data_.size_ = local_68.data_.size_;
        b_rdn_sequence.data_.data_ = local_68.data_.data_;
        bVar1 = VerifyNameMatch(a_rdn_sequence,b_rdn_sequence);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

[[nodiscard]] bool CheckResponderIDMatchesCertificate(
    const OCSPResponseData::ResponderID &id, const ParsedCertificate *cert) {
  switch (id.type) {
    case OCSPResponseData::ResponderType::NAME: {
      der::Input name_rdn;
      der::Input cert_rdn;
      if (!der::Parser(id.name).ReadTag(CBS_ASN1_SEQUENCE, &name_rdn) ||
          !der::Parser(cert->tbs().subject_tlv)
               .ReadTag(CBS_ASN1_SEQUENCE, &cert_rdn)) {
        return false;
      }
      return VerifyNameMatch(name_rdn, cert_rdn);
    }
    case OCSPResponseData::ResponderType::KEY_HASH: {
      der::Input key;
      if (!GetSubjectPublicKeyBytes(cert->tbs().spki_tlv, &key)) {
        return false;
      }
      return VerifyHash(EVP_sha1(), id.key_hash, key);
    }
  }

  return false;
}